

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O3

TypeID NULLCTypeInfo::GetFunctionContextType(NULLCRef obj)

{
  uint uVar1;
  char *__function;
  uint uVar2;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x14d,"TypeID NULLCTypeInfo::GetFunctionContextType(NULLCRef)");
  }
  if (in_stack_00000008 < *(uint *)(linker + 0x20c)) {
    if (*(int *)(*(long *)(linker + 0x200) + 0x10 + (ulong)in_stack_00000008 * 0x50) == 3) {
      uVar1 = *(uint *)(CONCAT44(obj.typeID,in_stack_0000000c) + 8);
      if (uVar1 < *(uint *)(linker + 0x24c)) {
        uVar1 = *(uint *)(*(long *)(linker + 0x240) + 0x4c + (ulong)uVar1 * 0x94);
        uVar2 = 0;
        if (uVar1 != 0xffffffff) {
          uVar2 = uVar1;
        }
        return (TypeID)uVar2;
      }
      __function = 
      "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
      ;
    }
    else {
      uVar1 = *(uint *)(*(long *)(linker + 0x200) + (ulong)in_stack_00000008 * 0x50);
      if (uVar1 < *(uint *)(linker + 0x29c)) {
        nullcThrowError("functionGetContextType: received type \'%s\' that is not a function",
                        (ulong)uVar1 + *(long *)(linker + 0x290));
        return (TypeID)0;
      }
      __function = 
      "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
      ;
    }
  }
  else {
    __function = 
    "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
    ;
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,__function);
}

Assistant:

TypeID GetFunctionContextType(NULLCRef obj)
	{
		assert(linker);

		ExternTypeInfo &type = linker->exTypes[obj.typeID];

		if(type.subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("functionGetContextType: received type '%s' that is not a function", &linker->exSymbols[type.offsetToName]);
			return getTypeID(0);
		}

		ExternFuncInfo &function = linker->exFunctions[*(int*)(obj.ptr + NULLC_PTR_SIZE)];
		return getTypeID(function.contextType != ~0u ? function.contextType : 0);
	}